

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello-imgui.cpp
# Opt level: O0

void keyboardCallback(GLFWwindow *window,int key,int scancode,int action,int modsls)

{
  ImGuiIO *pIVar1;
  ImGuiIO *io;
  int modsls_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  pIVar1 = ImGui::GetIO();
  if ((((pIVar1->WantCaptureKeyboard & 1U) == 0) && (action == 1)) && (key == 0x100)) {
    glfwSetWindowShouldClose(window,1);
  }
  return;
}

Assistant:

void
keyboardCallback(
	GLFWwindow* window,
	int key, int scancode, int action, int modsls
) {
	ImGuiIO& io = ImGui::GetIO();
	if (io.WantCaptureKeyboard)
		return;

	if (action == GLFW_PRESS) {
		switch (key) {
			case GLFW_KEY_ESCAPE:
				glfwSetWindowShouldClose(window, GL_TRUE);
			break;
			default: break;
		}
	}
}